

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O2

void __thiscall
mp::pre::Many2ManyLink::PresolveNames(Many2ManyLink *this,LinkIndexRange ir,ValueResolution vr)

{
  reference ppVar1;
  size_type __n;
  reference rVar2;
  
  __n = (size_type)ir.beg_;
  do {
    if ((long)ir >> 0x20 == __n) {
      return;
    }
    if (vr == ValResAll) {
LAB_0014ac7d:
      ppVar1 = std::
               _Deque_iterator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_&,_std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_*>
               ::operator[](&(this->entries_).
                             super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                             ._M_impl.super__Deque_impl_data._M_start,__n);
      Distr<mp::pre::VCString>(this,ppVar1->first,ppVar1->second,vr);
    }
    else {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->if_consider_for_last_link_,__n);
      if ((*rVar2._M_p & rVar2._M_mask) != 0) goto LAB_0014ac7d;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

LIST_PRESOLVE_METHODS

protected:
  /// Distribute values of type T from nr1 to nr2
  template <class T>
  void Distr(NodeRange nr1, NodeRange nr2, ValueResolution vr) {
    auto ir1 = nr1.GetIndexRange();
    auto ir2 = nr2.GetIndexRange();
    for (auto i0=ir1.beg_; i0!=ir1.end_; ++i0) {
      // Need reference here for reference counting
      // in PresolveNames():
      const auto& val = nr1.GetValueNode()->
          GetVal<T>(i0);
      if (ValueResolution::ValResAll == vr) {
        for (auto i=ir2.beg_; i!=ir2.end_; ++i)
          nr2.GetValueNode()->SetVal(i, val);
      } else {
        assert(ValueResolution::ValResLast == vr);
        nr2.GetValueNode()->SetVal(ir2.end_ - 1, val);
      }
    }